

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O1

psa_status_t
psa_its_set(psa_storage_uid_t uid,uint32_t data_length,void *p_data,
           psa_storage_create_flags_t create_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  FILE *__s;
  size_t sVar4;
  psa_status_t pVar5;
  psa_its_file_header_t header;
  char filename [25];
  undefined8 local_58;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  char local_48 [32];
  
  local_58 = 0x53544900415350;
  local_50 = (undefined1)data_length;
  local_4f = (undefined1)(data_length >> 8);
  local_4e = (undefined1)(data_length >> 0x10);
  local_4d = (undefined1)(data_length >> 0x18);
  local_4c = (undefined1)create_flags;
  local_4b = (undefined1)(create_flags >> 8);
  local_4a = (undefined1)(create_flags >> 0x10);
  local_49 = (undefined1)(create_flags >> 0x18);
  bVar1 = false;
  snprintf(local_48,0x19,"%s%08lx%08lx%s","",uid >> 0x20,uid & 0xffffffff,".psa_its");
  __s = fopen("tempfile.psa_its","wb");
  if (__s == (FILE *)0x0) {
    pVar5 = -0x92;
    goto LAB_00104681;
  }
  sVar4 = fwrite(&local_58,1,0x10,__s);
  pVar5 = -0x8e;
  if (sVar4 == 0x10) {
    if (data_length != 0) {
      sVar4 = fwrite(p_data,1,(ulong)data_length,__s);
      if (sVar4 != data_length) goto LAB_00104677;
    }
    pVar5 = 0;
    bVar1 = true;
  }
  else {
LAB_00104677:
    bVar1 = false;
  }
LAB_00104681:
  if (__s != (FILE *)0x0) {
    iVar2 = fclose(__s);
    iVar3 = -0x8e;
    if (iVar2 == 0) {
      iVar3 = pVar5;
    }
    if (bVar1) {
      pVar5 = iVar3;
    }
  }
  if (pVar5 == 0) {
    iVar3 = rename("tempfile.psa_its",local_48);
    pVar5 = -0x92;
    if (iVar3 == 0) {
      pVar5 = 0;
    }
  }
  remove("tempfile.psa_its");
  return pVar5;
}

Assistant:

psa_status_t psa_its_set( psa_storage_uid_t uid,
                          uint32_t data_length,
                          const void *p_data,
                          psa_storage_create_flags_t create_flags )
{
    psa_status_t status = PSA_ERROR_STORAGE_FAILURE;
    char filename[PSA_ITS_STORAGE_FILENAME_LENGTH];
    FILE *stream = NULL;
    psa_its_file_header_t header;
    size_t n;

    memcpy( header.magic, PSA_ITS_MAGIC_STRING, PSA_ITS_MAGIC_LENGTH );
    header.size[0] = data_length & 0xff;
    header.size[1] = ( data_length >> 8 ) & 0xff;
    header.size[2] = ( data_length >> 16 ) & 0xff;
    header.size[3] = ( data_length >> 24 ) & 0xff;
    header.flags[0] = create_flags & 0xff;
    header.flags[1] = ( create_flags >> 8 ) & 0xff;
    header.flags[2] = ( create_flags >> 16 ) & 0xff;
    header.flags[3] = ( create_flags >> 24 ) & 0xff;

    psa_its_fill_filename( uid, filename );
    stream = fopen( PSA_ITS_STORAGE_TEMP, "wb" );
    if( stream == NULL )
        goto exit;

    status = PSA_ERROR_INSUFFICIENT_STORAGE;
    n = fwrite( &header, 1, sizeof( header ), stream );
    if( n != sizeof( header ) )
        goto exit;
    if( data_length != 0 )
    {
        n = fwrite( p_data, 1, data_length, stream );
        if( n != data_length )
            goto exit;
    }
    status = PSA_SUCCESS;

exit:
    if( stream != NULL )
    {
        int ret = fclose( stream );
        if( status == PSA_SUCCESS && ret != 0 )
            status = PSA_ERROR_INSUFFICIENT_STORAGE;
    }
    if( status == PSA_SUCCESS )
    {
        if( rename_replace_existing( PSA_ITS_STORAGE_TEMP, filename ) != 0 )
            status = PSA_ERROR_STORAGE_FAILURE;
    }
    remove( PSA_ITS_STORAGE_TEMP );
    return( status );
}